

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O0

DataBlob __thiscall
hrgls::datablob::DataBlobSource::GetNextBlob(DataBlobSource *this,timeval timeout)

{
  hrgls_DataBlob phVar1;
  mapped_type mVar2;
  mapped_type *pmVar3;
  undefined8 in_RCX;
  DataBlob_private *pDVar4;
  key_type local_78;
  key_type local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  hrgls_DataBlob local_50;
  hrgls_DataBlob blob;
  undefined4 local_40;
  DataBlob local_30;
  DataBlob emptyRet;
  DataBlobSource *this_local;
  timeval timeout_local;
  DataBlob *ret;
  
  pDVar4 = (DataBlob_private *)timeout.tv_sec;
  emptyRet.m_private = pDVar4;
  DataBlob::DataBlob(&local_30);
  if (pDVar4->blob == (hrgls_DataBlob)0x0) {
    DataBlob::DataBlob((DataBlob *)this,&local_30);
  }
  else if (*(long *)pDVar4->blob == 0) {
    phVar1 = pDVar4->blob;
    blob = (hrgls_DataBlob)std::this_thread::get_id();
    pmVar3 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[]((map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                           *)(phVar1 + 8),(key_type *)&blob);
    *pmVar3 = 0x3ee;
    DataBlob::DataBlob((DataBlob *)this,&local_30);
  }
  else {
    local_50 = (hrgls_DataBlob)0x0;
    this_local._0_4_ = (undefined4)timeout.tv_usec;
    this_local._4_4_ = timeout.tv_usec._4_4_;
    timeout_local.tv_sec._0_4_ = (undefined4)in_RCX;
    timeout_local.tv_sec._4_4_ = (undefined4)((ulong)in_RCX >> 0x20);
    local_68 = this_local._0_4_;
    uStack_64 = this_local._4_4_;
    uStack_60 = (undefined4)timeout_local.tv_sec;
    uStack_5c = timeout_local.tv_sec._4_4_;
    mVar2 = hrgls_DataBlobSourceGetNextBlob
                      (*(undefined8 *)pDVar4->blob,&local_50,timeout.tv_usec,in_RCX);
    phVar1 = pDVar4->blob;
    local_70._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar3 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[]((map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                           *)(phVar1 + 8),&local_70);
    *pmVar3 = mVar2;
    phVar1 = pDVar4->blob;
    local_78._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar3 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[]((map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                           *)(phVar1 + 8),&local_78);
    if (*pmVar3 == 1) {
      hrgls_DataBlobDestroy(local_50);
      DataBlob::DataBlob((DataBlob *)this,&local_30);
    }
    else {
      DataBlob::DataBlob((DataBlob *)this,local_50);
      hrgls_DataBlobDestroy(local_50);
    }
  }
  local_40 = 1;
  DataBlob::~DataBlob(&local_30);
  return (DataBlob)(DataBlob_private *)this;
}

Assistant:

DataBlob DataBlobSource::GetNextBlob(struct timeval timeout)
    {
      DataBlob emptyRet;
      if (!m_private) {
        return emptyRet;
      }
      if (!m_private->m_stream) {
        m_private->m_status[std::this_thread::get_id()] = hrgls_STATUS_NULL_OBJECT_POINTER;
        return emptyRet;
      }
      hrgls_DataBlob blob = nullptr;
      m_private->m_status[std::this_thread::get_id()] = hrgls_DataBlobSourceGetNextBlob(m_private->m_stream, &blob, timeout);
      if (m_private->m_status[std::this_thread::get_id()] == hrgls_STATUS_TIMEOUT) {
        hrgls_DataBlobDestroy(blob);
        return emptyRet;
      }
      DataBlob ret(blob);
      hrgls_DataBlobDestroy(blob);
      return ret;
    }